

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerResults.cpp
# Opt level: O0

void __thiscall
I2cAnalyzerResults::GenerateFrameTabularText
          (I2cAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  ostream *poVar1;
  char *pcVar2;
  string local_670 [32];
  stringstream local_650 [8];
  stringstream ss_2;
  ostream local_640 [376];
  char local_4c8 [8];
  char number_str_1 [128];
  stringstream local_428 [8];
  stringstream ss_1;
  ostream local_418 [376];
  string local_2a0 [32];
  stringstream local_280 [8];
  stringstream ss;
  ostream local_270 [376];
  uint local_f8;
  I2cDirection direction;
  char local_e8 [8];
  char number_str [128];
  char ack [32];
  Frame frame;
  ulong local_38;
  char local_28;
  byte local_27;
  DisplayBase display_base_local;
  U64 frame_index_local;
  I2cAnalyzerResults *this_local;
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)(ack + 0x18));
  if ((local_27 & 1) == 0) {
    if ((local_27 & 2) == 0) {
      snprintf(number_str + 0x78,0x20,"NAK");
    }
    else {
      snprintf(number_str + 0x78,0x20,"Missing ACK/NAK");
    }
  }
  else {
    snprintf(number_str + 0x78,0x20,"ACK");
  }
  if (local_28 == '\0') {
    AnalyzerHelpers::GetNumberString(local_38 >> 1,display_base,7,local_e8,0x80);
    local_f8 = (uint)((local_38 & 1) == 0);
    if (local_f8 == 0) {
      std::__cxx11::stringstream::stringstream(local_280);
      poVar1 = std::operator<<(local_270,"Setup Read to [");
      poVar1 = std::operator<<(poVar1,local_e8);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,number_str + 0x78);
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddTabularText
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::stringstream::~stringstream(local_280);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_428);
      poVar1 = std::operator<<(local_418,"Setup Write to [");
      poVar1 = std::operator<<(poVar1,local_e8);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,number_str + 0x78);
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddTabularText
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)(number_str_1 + 0x78));
      std::__cxx11::stringstream::~stringstream(local_428);
    }
  }
  else {
    AnalyzerHelpers::GetNumberString(local_38,display_base,8,local_4c8,0x80);
    std::__cxx11::stringstream::stringstream(local_650);
    poVar1 = std::operator<<(local_640,local_4c8);
    poVar1 = std::operator<<(poVar1," + ");
    std::operator<<(poVar1,number_str + 0x78);
    std::__cxx11::stringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddTabularText
              ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_670);
    std::__cxx11::stringstream::~stringstream(local_650);
  }
  Frame::~Frame((Frame *)(ack + 0x18));
  return;
}

Assistant:

void I2cAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    char ack[ 32 ];
    if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "ACK" );
    else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
    else
        snprintf( ack, sizeof( ack ), "NAK" );

    if( frame.mType == I2cAddress )
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );

        I2cDirection direction;
        if( ( frame.mData1 & 0x1 ) != 0 )
            direction = I2C_READ;
        else
            direction = I2C_WRITE;

        if( direction == I2C_READ )
        {
            std::stringstream ss;
            ss << "Setup Read to [" << number_str << "] + " << ack;
            AddTabularText( ss.str().c_str() );
        }
        else
        {
            std::stringstream ss;
            ss << "Setup Write to [" << number_str << "] + " << ack;
            AddTabularText( ss.str().c_str() );
        }
    }
    else
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
        std::stringstream ss;
        ss << number_str << " + " << ack;
        AddTabularText( ss.str().c_str() );
    }
}